

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

bool FIX::Session::sendToTarget(Message *message,string *qualifier)

{
  bool bVar1;
  FieldNotFound *anon_var_0;
  undefined1 local_168 [8];
  SessionID sessionID;
  string *qualifier_local;
  Message *message_local;
  
  sessionID.m_frozenString.field_2._8_8_ = qualifier;
  Message::getSessionID((SessionID *)local_168,message,qualifier);
  bVar1 = sendToTarget(message,(SessionID *)local_168);
  SessionID::~SessionID((SessionID *)local_168);
  return bVar1;
}

Assistant:

EXCEPT(SessionNotFound) {
  try {
    SessionID sessionID = message.getSessionID(qualifier);
    return sendToTarget(message, sessionID);
  } catch (FieldNotFound &) {
    throw SessionNotFound();
  }
}